

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O3

duckdb_logical_type
duckdb_create_map_type(duckdb_logical_type key_type,duckdb_logical_type value_type)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  LogicalType *this;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  if (value_type == (duckdb_logical_type)0x0 || key_type == (duckdb_logical_type)0x0) {
    this = (LogicalType *)0x0;
  }
  else {
    this = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(this);
    duckdb::LogicalType::LogicalType(&local_48,(LogicalType *)key_type);
    duckdb::LogicalType::LogicalType(&local_60,(LogicalType *)value_type);
    duckdb::LogicalType::MAP(&local_30,&local_48,&local_60);
    this->id_ = local_30.id_;
    this->physical_type_ = local_30.physical_type_;
    peVar1 = (this->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (this->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_30.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_30.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_30.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    local_30.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2
    ;
    duckdb::LogicalType::~LogicalType(&local_30);
    duckdb::LogicalType::~LogicalType(&local_60);
    duckdb::LogicalType::~LogicalType(&local_48);
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_create_map_type(duckdb_logical_type key_type, duckdb_logical_type value_type) {
	if (!key_type || !value_type) {
		return nullptr;
	}
	duckdb::LogicalType *mtype = new duckdb::LogicalType;
	*mtype = duckdb::LogicalType::MAP(*reinterpret_cast<duckdb::LogicalType *>(key_type),
	                                  *reinterpret_cast<duckdb::LogicalType *>(value_type));
	return reinterpret_cast<duckdb_logical_type>(mtype);
}